

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_conv_transpose_1d(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int64_t iVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  int iVar13;
  size_t sVar14;
  undefined4 *puVar15;
  int iVar16;
  long lVar17;
  void *pvVar18;
  char *pcVar19;
  undefined2 *puVar20;
  long lVar21;
  undefined4 *puVar22;
  long lVar23;
  long lVar24;
  undefined8 uVar25;
  undefined2 *puVar26;
  long lVar27;
  undefined4 *puVar28;
  long lVar29;
  undefined2 *puVar30;
  undefined4 *puVar31;
  long lVar32;
  float *pfVar33;
  int iVar34;
  undefined1 auVar35 [16];
  long local_b0;
  float *local_a8;
  long local_a0;
  long local_98;
  float local_38;
  float local_34;
  
  pgVar2 = dst->src[0];
  if (pgVar2->type == GGML_TYPE_F32) {
    pgVar3 = dst->src[1];
    if (pgVar3->type == GGML_TYPE_F32) {
      if (dst->type == GGML_TYPE_F32) {
        if (pgVar2->nb[0] == 4) {
          if (pgVar3->nb[0] == 4) {
            lVar4 = pgVar3->ne[1];
            lVar5 = pgVar2->ne[0];
            lVar6 = pgVar2->ne[2];
            lVar27 = pgVar2->ne[1];
            lVar7 = pgVar3->ne[0];
            iVar34 = params->ith;
            iVar8 = dst->ne[1];
            sVar9 = dst->nb[1];
            iVar13 = params->nth;
            lVar17 = lVar6 * lVar5;
            iVar16 = (int)lVar17 * (int)lVar27;
            if (iVar34 == 0) {
              sVar10 = pgVar3->nb[1];
              sVar11 = pgVar2->nb[1];
              sVar12 = pgVar2->nb[2];
              memset(params->wdata,0,params->wsize);
              puVar15 = (undefined4 *)params->wdata;
              if (0 < lVar6) {
                lVar24 = 0;
                lVar21 = 0;
                puVar28 = puVar15;
                do {
                  if (0 < lVar27) {
                    lVar32 = 0;
                    lVar29 = (long)pgVar2->data + lVar24;
                    puVar31 = puVar28;
                    do {
                      if (0 < lVar5) {
                        lVar23 = 0;
                        puVar22 = puVar31;
                        do {
                          lVar1 = lVar23 * 4;
                          lVar23 = lVar23 + 1;
                          *puVar22 = *(undefined4 *)(lVar29 + lVar1);
                          puVar22 = puVar22 + lVar6;
                        } while (lVar5 != lVar23);
                      }
                      lVar32 = lVar32 + 1;
                      puVar31 = puVar31 + lVar17;
                      lVar29 = lVar29 + sVar11;
                    } while (lVar32 != lVar27);
                  }
                  lVar21 = lVar21 + 1;
                  puVar28 = puVar28 + 1;
                  lVar24 = lVar24 + sVar12;
                } while (lVar21 != lVar6);
              }
              if (0 < lVar4) {
                lVar27 = 0;
                puVar15 = puVar15 + iVar16;
                pvVar18 = pgVar3->data;
                do {
                  if (0 < lVar7) {
                    lVar24 = 0;
                    puVar28 = puVar15;
                    do {
                      lVar21 = lVar24 * 4;
                      lVar24 = lVar24 + 1;
                      *puVar28 = *(undefined4 *)((long)pvVar18 + lVar21);
                      puVar28 = puVar28 + lVar4;
                    } while (lVar7 != lVar24);
                  }
                  lVar27 = lVar27 + 1;
                  puVar15 = puVar15 + 1;
                  pvVar18 = (void *)((long)pvVar18 + sVar10);
                } while (lVar27 != lVar4);
              }
              pvVar18 = dst->data;
              sVar14 = ggml_nbytes();
              memset(pvVar18,0,sVar14);
            }
            local_b0 = (long)iVar16 * 4;
            iVar16 = (int)iVar8;
            ggml_barrier(params->threadpool);
            iVar13 = (iVar16 + -1 + iVar13) / iVar13;
            iVar34 = iVar34 * iVar13;
            iVar13 = iVar13 + iVar34;
            if (iVar16 <= iVar13) {
              iVar13 = iVar16;
            }
            if (iVar13 <= iVar34) {
              return;
            }
            pvVar18 = params->wdata;
            lVar27 = (long)iVar34;
            iVar34 = dst->op_params[0];
            local_98 = sVar9 * lVar27;
            local_a8 = (float *)((long)pvVar18 + lVar17 * lVar27 * 4);
            do {
              if (0 < lVar7) {
                local_a0 = 0;
                lVar24 = (long)dst->data + local_98;
                do {
                  if (0 < lVar5) {
                    lVar21 = 0;
                    pfVar33 = local_a8;
                    do {
                      local_34 = 0.0;
                      ggml_vec_dot_f32((int)lVar6,&local_34,0,
                                       (float *)((long)pvVar18 +
                                                ((lVar4 << 0x20) * local_a0 >> 0x1e) + local_b0),0,
                                       pfVar33,0,1);
                      pfVar33 = pfVar33 + lVar6;
                      *(float *)(lVar24 + lVar21 * 4) = local_34 + *(float *)(lVar24 + lVar21 * 4);
                      lVar21 = lVar21 + 1;
                    } while (lVar5 != lVar21);
                  }
                  lVar24 = lVar24 + (long)iVar34 * 4;
                  local_a0 = local_a0 + 1;
                } while (local_a0 != lVar7);
              }
              local_98 = local_98 + sVar9;
              local_a8 = local_a8 + lVar17;
              lVar27 = lVar27 + 1;
            } while (iVar13 != (int)lVar27);
            return;
          }
          pcVar19 = "nb10 == sizeof(float)";
          uVar25 = 0x15ed;
        }
        else {
          pcVar19 = "nb00 == sizeof(float)";
          uVar25 = 0x15ec;
        }
      }
      else {
        pcVar19 = "dst->type == GGML_TYPE_F32";
        uVar25 = 0x15e3;
      }
    }
    else {
      pcVar19 = "src1->type == GGML_TYPE_F32";
      uVar25 = 0x15e2;
    }
  }
  else {
    if (pgVar2->type != GGML_TYPE_F16) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0x1643,"fatal error");
    }
    pgVar3 = dst->src[1];
    if (pgVar3->type == GGML_TYPE_F32) {
      if (dst->type == GGML_TYPE_F32) {
        if (pgVar2->nb[0] == 2) {
          if (pgVar3->nb[0] == 4) {
            lVar4 = pgVar3->ne[1];
            lVar5 = pgVar2->ne[0];
            lVar6 = pgVar2->ne[2];
            lVar27 = pgVar2->ne[1];
            lVar7 = pgVar3->ne[0];
            iVar34 = params->ith;
            iVar8 = dst->ne[1];
            sVar9 = dst->nb[1];
            iVar13 = params->nth;
            lVar17 = lVar6 * lVar5;
            if (iVar34 == 0) {
              sVar10 = pgVar3->nb[1];
              sVar11 = pgVar2->nb[1];
              sVar12 = pgVar2->nb[2];
              memset(params->wdata,0,params->wsize);
              puVar26 = (undefined2 *)params->wdata;
              if (0 < lVar6) {
                lVar24 = 0;
                lVar21 = 0;
                do {
                  if (0 < lVar27) {
                    lVar32 = 0;
                    lVar29 = (long)pgVar2->data + lVar24;
                    puVar30 = puVar26;
                    do {
                      if (0 < lVar5) {
                        lVar23 = 0;
                        puVar20 = puVar30;
                        do {
                          lVar1 = lVar23 * 2;
                          lVar23 = lVar23 + 1;
                          *puVar20 = *(undefined2 *)(lVar29 + lVar1);
                          puVar20 = puVar20 + lVar6;
                        } while (lVar5 != lVar23);
                      }
                      lVar32 = lVar32 + 1;
                      puVar30 = puVar30 + lVar17;
                      lVar29 = lVar29 + sVar11;
                    } while (lVar32 != lVar27);
                  }
                  lVar21 = lVar21 + 1;
                  puVar26 = puVar26 + 1;
                  lVar24 = lVar24 + sVar12;
                } while (lVar21 != lVar6);
              }
              if (0 < lVar4) {
                lVar24 = 0;
                pvVar18 = pgVar3->data;
                do {
                  if (0 < lVar7) {
                    lVar21 = 0;
                    do {
                      lVar29 = lVar21 * 4;
                      lVar21 = lVar21 + 1;
                      auVar35 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar18 + lVar29)),0);
                      vpextrw_avx(auVar35,0);
                    } while (lVar7 != lVar21);
                  }
                  lVar24 = lVar24 + 1;
                  pvVar18 = (void *)((long)pvVar18 + sVar10);
                } while (lVar24 != lVar4);
              }
              pvVar18 = dst->data;
              sVar14 = ggml_nbytes();
              memset(pvVar18,0,sVar14);
            }
            local_b0 = (long)((int)lVar17 * (int)lVar27) * 2;
            iVar16 = (int)iVar8;
            ggml_barrier(params->threadpool);
            iVar13 = (iVar16 + -1 + iVar13) / iVar13;
            iVar34 = iVar34 * iVar13;
            iVar13 = iVar13 + iVar34;
            if (iVar16 <= iVar13) {
              iVar13 = iVar16;
            }
            if (iVar34 < iVar13) {
              pvVar18 = params->wdata;
              lVar27 = (long)iVar34;
              iVar34 = dst->op_params[0];
              local_98 = sVar9 * lVar27;
              local_a8 = (float *)((long)pvVar18 + lVar17 * lVar27 * 2);
              do {
                if (0 < lVar7) {
                  local_a0 = 0;
                  lVar24 = (long)dst->data + local_98;
                  do {
                    if (0 < lVar5) {
                      lVar21 = 0;
                      pfVar33 = local_a8;
                      do {
                        local_38 = 0.0;
                        ggml_vec_dot_f16((int)lVar6,&local_38,0,
                                         (ggml_fp16_t *)
                                         ((long)pvVar18 +
                                         ((lVar4 << 0x20) * local_a0 >> 0x1f) + local_b0),0,
                                         (ggml_fp16_t *)pfVar33,0,1);
                        pfVar33 = (float *)((long)pfVar33 + lVar6 * 2);
                        *(float *)(lVar24 + lVar21 * 4) = local_38 + *(float *)(lVar24 + lVar21 * 4)
                        ;
                        lVar21 = lVar21 + 1;
                      } while (lVar5 != lVar21);
                    }
                    lVar24 = lVar24 + (long)iVar34 * 4;
                    local_a0 = local_a0 + 1;
                  } while (local_a0 != lVar7);
                }
                local_98 = local_98 + sVar9;
                local_a8 = (float *)((long)local_a8 + lVar17 * 2);
                lVar27 = lVar27 + 1;
              } while (iVar13 != (int)lVar27);
            }
            return;
          }
          pcVar19 = "nb10 == sizeof(float)";
          uVar25 = 0x1595;
        }
        else {
          pcVar19 = "nb00 == sizeof(ggml_fp16_t)";
          uVar25 = 0x1594;
        }
      }
      else {
        pcVar19 = "dst->type == GGML_TYPE_F32";
        uVar25 = 0x158b;
      }
    }
    else {
      pcVar19 = "src1->type == GGML_TYPE_F32";
      uVar25 = 0x158a;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar25,"GGML_ASSERT(%s) failed",pcVar19);
}

Assistant:

void ggml_compute_forward_conv_transpose_1d(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_conv_transpose_1d_f16_f32(params, dst);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_conv_transpose_1d_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}